

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraCodeBlocksGenerator.cxx
# Opt level: O2

void __thiscall
cmExtraCodeBlocksGenerator::CreateProjectFile
          (cmExtraCodeBlocksGenerator *this,
          vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *lgs)

{
  string *psVar1;
  string outputDir;
  string projectName;
  string filename;
  string sessionFilename;
  char *local_f8;
  size_t local_f0;
  string local_d8;
  string local_b8;
  string local_98;
  cmAlphaNum local_78;
  cmAlphaNum local_48;
  
  psVar1 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_
                     (*(lgs->
                       super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>).
                       _M_impl.super__Vector_impl_data._M_start);
  std::__cxx11::string::string((string *)&local_f8,(string *)psVar1);
  cmLocalGenerator::GetProjectName_abi_cxx11_
            (&local_d8,
             *(lgs->super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>).
              _M_impl.super__Vector_impl_data._M_start);
  local_48.View_._M_len = local_f0;
  local_48.View_._M_str = local_f8;
  local_78.View_._M_len = 1;
  local_78.Digits_[0] = '/';
  local_78.View_._M_str = local_78.Digits_;
  cmStrCat<std::__cxx11::string,char[5]>
            (&local_b8,&local_48,&local_78,&local_d8,(char (*) [5])".cbp");
  local_48.View_._M_len = local_f0;
  local_48.View_._M_str = local_f8;
  local_78.View_._M_len = 1;
  local_78.Digits_[0] = '/';
  local_78.View_._M_str = local_78.Digits_;
  cmStrCat<std::__cxx11::string,char[8]>
            (&local_98,&local_48,&local_78,&local_d8,(char (*) [8])".layout");
  CreateNewProjectFile(this,lgs,&local_b8);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_f8);
  return;
}

Assistant:

void cmExtraCodeBlocksGenerator::CreateProjectFile(
  const std::vector<cmLocalGenerator*>& lgs)
{
  std::string outputDir = lgs[0]->GetCurrentBinaryDirectory();
  std::string projectName = lgs[0]->GetProjectName();

  std::string filename = cmStrCat(outputDir, '/', projectName, ".cbp");
  std::string sessionFilename =
    cmStrCat(outputDir, '/', projectName, ".layout");

  this->CreateNewProjectFile(lgs, filename);
}